

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glucose.cpp
# Opt level: O2

Lit __thiscall Gluco::Solver::pickBranchLit(Solver *this)

{
  double *seed;
  int size;
  bool bVar1;
  int iVar2;
  double dVar3;
  lbool local_3a;
  lbool local_39;
  double *local_38;
  
  seed = &this->random_seed;
  dVar3 = drand(seed);
  iVar2 = -1;
  if ((dVar3 < this->random_var_freq) && (size = (this->order_heap).heap.sz, size != 0)) {
    iVar2 = irand(seed,size);
    iVar2 = Heap<Gluco::Solver::VarOrderLt>::operator[](&this->order_heap,iVar2);
    local_39.value = (this->assigns).data[iVar2].value;
    bVar1 = lbool::operator==(&local_39,(lbool)0x2);
    if ((bVar1) && ((this->decision).data[iVar2] != '\0')) {
      this->rnd_decisions = this->rnd_decisions + 1;
    }
  }
  local_38 = seed;
  do {
    if (iVar2 != -1) {
      local_3a.value = (this->assigns).data[iVar2].value;
      bVar1 = lbool::operator!=(&local_3a,(lbool)0x2);
      if ((!bVar1) && ((this->decision).data[iVar2] != '\0')) {
        if (this->rnd_pol == true) {
          dVar3 = drand(local_38);
          bVar1 = dVar3 < 0.5;
        }
        else {
          bVar1 = (this->polarity).data[iVar2] != '\0';
        }
        return (Lit)((uint)bVar1 + iVar2 * 2);
      }
    }
    if ((this->order_heap).heap.sz == 0) {
      return (Lit)-2;
    }
    iVar2 = Heap<Gluco::Solver::VarOrderLt>::removeMin(&this->order_heap);
  } while( true );
}

Assistant:

Lit Solver::pickBranchLit()
{
    Var next = var_Undef;

    // Random decision:
    if (drand(random_seed) < random_var_freq && !order_heap.empty()){
        next = order_heap[irand(random_seed,order_heap.size())];
        if (value(next) == l_Undef && decision[next])
            rnd_decisions++; }

    // Activity based decision:
    while (next == var_Undef || value(next) != l_Undef || !decision[next])
        if (order_heap.empty()){
            next = var_Undef;
            break;
        }else
            next = order_heap.removeMin();
    
    return next == var_Undef ? lit_Undef : mkLit(next, rnd_pol ? drand(random_seed) < 0.5 : (polarity[next] != 0));
}